

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

size_t __thiscall flexbuffers::Builder::String(Builder *this,char *str,size_t len)

{
  unsigned_long uVar1;
  bool bVar2;
  size_type_conflict __new_size;
  pointer ppVar3;
  reference pvVar4;
  _Self local_50;
  _Self local_48;
  iterator it;
  StringOffset so;
  size_t sloc;
  size_type_conflict reset_to;
  size_t len_local;
  char *str_local;
  Builder *this_local;
  
  reset_to = len;
  len_local = (size_t)str;
  str_local = (char *)this;
  __new_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
  so.second = CreateBlob(this,(void *)len_local,reset_to,1,FBT_STRING);
  if ((this->flags_ & BUILDER_FLAG_SHARE_STRINGS) != BUILDER_FLAG_NONE) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
              ((pair<unsigned_long,_unsigned_long> *)&it,&so.second,&reset_to);
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::pair<unsigned_long,_unsigned_long>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::find(&this->string_pool,(key_type *)&it);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<std::pair<unsigned_long,_unsigned_long>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::end(&this->string_pool);
    bVar2 = std::operator!=(&local_48,&local_50);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buf_,__new_size);
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<unsigned_long,_unsigned_long>_>::operator->
                         (&local_48);
      uVar1 = ppVar3->first;
      so.second = uVar1;
      pvVar4 = std::
               vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
               back(&this->stack_);
      (pvVar4->field_0).u_ = uVar1;
    }
    else {
      std::
      set<std::pair<unsigned_long,_unsigned_long>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::insert(&this->string_pool,(value_type *)&it);
    }
  }
  return so.second;
}

Assistant:

size_t String(const char *str, size_t len) {
    auto reset_to = buf_.size();
    auto sloc = CreateBlob(str, len, 1, FBT_STRING);
    if (flags_ & BUILDER_FLAG_SHARE_STRINGS) {
      StringOffset so(sloc, len);
      auto it = string_pool.find(so);
      if (it != string_pool.end()) {
        // Already in the buffer. Remove string we just serialized, and use
        // existing offset instead.
        buf_.resize(reset_to);
        sloc = it->first;
        stack_.back().u_ = sloc;
      } else {
        string_pool.insert(so);
      }
    }
    return sloc;
  }